

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::removeClause(SAT *this,Clause *c)

{
  int *piVar1;
  uint uVar2;
  Lit *pLVar3;
  mapped_type *pmVar4;
  uint i;
  uint i_00;
  int id;
  undefined4 uStack_24;
  
  i_00 = 0;
  pLVar3 = Clause::operator[](c,0);
  _id = c;
  vec<WatchElem>::remove((this->watches).data + ((ulong)(uint)pLVar3->x ^ 1),(char *)&id);
  pLVar3 = Clause::operator[](c,1);
  _id = c;
  vec<WatchElem>::remove((this->watches).data + ((ulong)(uint)pLVar3->x ^ 1),(char *)&id);
  (&this->clauses_literals)[*(uint *)c & 1] =
       (&this->clauses_literals)[*(uint *)c & 1] - (ulong)(*(uint *)c >> 8);
  uVar2 = *(uint *)c;
  if ((uVar2 & 1) != 0) {
    for (; i_00 < uVar2 >> 8; i_00 = i_00 + 1) {
      pLVar3 = Clause::operator[](c,i_00);
      uVar2 = (pLVar3->x >> 1) - this->orig_cutoff;
      if (-1 < (int)uVar2) {
        piVar1 = (this->num_used).data + uVar2;
        *piVar1 = *piVar1 + -1;
      }
      uVar2 = *(uint *)c;
    }
    if (((uVar2 & 1) != 0) && (so.learnt_stats == true)) {
      _id = (Clause *)CONCAT44(uStack_24,c[1].data[uVar2 >> 8].x);
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&learntClauseString_abi_cxx11_,&id);
      std::operator<<((ostream *)learntStatsStream,(string *)pmVar4);
      std::operator<<((ostream *)learntStatsStream,",");
      std::ostream::operator<<
                ((ostream *)learntStatsStream,c[1].data[(ulong)(*(uint *)c >> 8) - 1].x);
      std::operator<<((ostream *)learntStatsStream,"\n");
    }
  }
  free(c);
  return;
}

Assistant:

void SAT::removeClause(Clause& c) {
	assert(c.size() > 1);
	watches[toInt(~c[0])].remove(&c);
	watches[toInt(~c[1])].remove(&c);
	if (c.learnt) {
		learnts_literals -= c.size();
	} else {
		clauses_literals -= c.size();
	}

	if (c.learnt) {
		for (unsigned int i = 0; i < c.size(); i++) {
			decVarUse(var(c[i]));
		}
	}

	if (c.learnt) {
		//            learntClauseScore[c.clauseID()] = c.rawActivity();
		/* if (so.debug) { */
		if (so.learnt_stats) {
			const int id = c.clauseID();
			learntStatsStream << learntClauseString[id];
			learntStatsStream << ",";
			learntStatsStream << c.rawActivity();
			learntStatsStream << "\n";
			/* std::cerr << "clausescore," <<  << "," << c.rawActivity() << "\n"; */
		}
		/* } */
	}

	free(&c);
}